

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
phmap::priv::
btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
::split(btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
        *this,int insert_position,
       btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
       *dest,allocator_type *alloc)

{
  btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::SubstringLess,std::allocator<std::__cxx11::string>,256,false>>
  bVar1;
  btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::SubstringLess,std::allocator<std::__cxx11::string>,256,false>>
  *this_00;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  bVar2;
  btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::SubstringLess,std::allocator<std::__cxx11::string>,256,false>>
  bVar3;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *pbVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **args;
  allocator_type *extraout_RDX;
  allocator_type *extraout_RDX_00;
  allocator_type *extraout_RDX_01;
  allocator_type *extraout_RDX_02;
  allocator_type *extraout_RDX_03;
  allocator_type *extraout_RDX_04;
  allocator_type *paVar5;
  uint i;
  ulong uVar6;
  allocator_type *in_R9;
  ulong uVar7;
  string *psVar8;
  size_type sVar9;
  long lVar10;
  btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
  *local_40;
  btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::SubstringLess,std::allocator<std::__cxx11::string>,256,false>>
  *local_38;
  
  if (((ulong)dest & 7) == 0) {
    if (dest[10] !=
        (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
         )0x0) {
      __assert_fail("dest->count() == 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                    ,0x8fb,
                    "void phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>]"
                   );
    }
    if (((ulong)this & 7) == 0) {
      if ((this[0xb] !=
           (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
            )0x0) &&
         (this[0xb] !=
          (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
           )0x7)) {
        __assert_fail("max_count() == kNodeValues",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x8fc,
                      "void phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>]"
                     );
      }
      if (insert_position == 7) {
        bVar2 = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                 )0x0;
      }
      else if (insert_position == 0) {
        bVar2 = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                 )((char)this[10] - 1);
      }
      else {
        bVar2 = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                 )((byte)this[10] >> 1);
      }
      dest[10] = bVar2;
      bVar2 = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
               )((char)this[10] - (char)bVar2);
      this[10] = bVar2;
      if (bVar2 == (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                    )0x0) {
        __assert_fail("count() >= 1",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                      ,0x90a,
                      "void phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>]"
                     );
      }
      args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)0x0;
      uninitialized_move_n(this,(ulong)(byte)dest[10],(ulong)(byte)bVar2,0,dest,in_R9);
      uVar7 = (ulong)(byte)dest[10];
      if (uVar7 != 0) {
        sVar9 = (size_type)(byte)this[10];
        paVar5 = extraout_RDX;
        do {
          value_destroy(this,sVar9,paVar5);
          sVar9 = sVar9 + 1;
          uVar7 = uVar7 - 1;
          paVar5 = extraout_RDX_00;
        } while (uVar7 != 0);
      }
      bVar2 = this[10];
      this[10] = (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                  )((char)bVar2 - 1U);
      this_00 = *(btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::SubstringLess,std::allocator<std::__cxx11::string>,256,false>>
                  **)this;
      bVar3 = *(btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::SubstringLess,std::allocator<std::__cxx11::string>,256,false>>
                *)(this + 8);
      uVar7 = (ulong)(byte)bVar3;
      local_40 = this + (ulong)(byte)((char)bVar2 - 1U) * 0x20 + 0x10;
      if (((ulong)this_00 & 7) == 0) {
        bVar1 = this_00[10];
        if ((byte)bVar1 < (byte)bVar3) {
          __assert_fail("i <= count()",
                        "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                        ,0x852,
                        "void phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>>::emplace_value(const size_type, allocator_type *, Args &&...) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>, Args = <std::basic_string<char> *>]"
                       );
        }
        if ((byte)bVar3 < (byte)bVar1) {
          local_38 = this_00 + (ulong)(byte)bVar1 * 0x20 + -0x10;
          btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::SubstringLess,std::allocator<std::__cxx11::string>,256,false>>
          ::value_init<std::__cxx11::string*>
                    (this_00,(ulong)(byte)bVar1,(allocator_type *)&local_38,args);
          uVar6 = (ulong)(byte)this_00[10] - 1;
          paVar5 = extraout_RDX_01;
          if (uVar7 < uVar6) {
            psVar8 = (string *)(this_00 + (ulong)(byte)this_00[10] * 0x20 + -0x30);
            do {
              std::__cxx11::string::operator=(psVar8 + 0x20,psVar8);
              uVar6 = uVar6 - 1;
              psVar8 = psVar8 + -0x20;
              paVar5 = extraout_RDX_02;
            } while (uVar7 < uVar6);
          }
          value_destroy((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                         *)this_00,uVar7,paVar5);
        }
        btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::SubstringLess,std::allocator<std::__cxx11::string>,256,false>>
        ::value_init<std::__cxx11::string*>(this_00,uVar7,(allocator_type *)&local_40,args);
        bVar3 = (btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::SubstringLess,std::allocator<std::__cxx11::string>,256,false>>
                 )((char)this_00[10] + '\x01');
        this_00[10] = bVar3;
        paVar5 = extraout_RDX_03;
        if (this_00[0xb] ==
            (btree_node<phmap::priv::set_params<std::__cxx11::string,phmap::priv::(anonymous_namespace)::SubstringLess,std::allocator<std::__cxx11::string>,256,false>>
             )0x0) {
          uVar7 = uVar7 + 1;
          if (uVar7 < (byte)bVar3) {
            uVar6 = (ulong)(byte)bVar3;
            if ((uint)uVar7 < (uint)(byte)bVar3) {
              do {
                sVar9 = uVar6 - 1;
                pbVar4 = child((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                                *)this_00,sVar9);
                set_child((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                           *)this_00,uVar6,pbVar4);
                uVar6 = sVar9;
              } while ((long)uVar7 < (long)sVar9);
            }
            mutable_child((btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                           *)this_00,uVar7);
            paVar5 = extraout_RDX_04;
          }
        }
        value_destroy(this,(ulong)(byte)this[10],paVar5);
        init_child(*(btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                     **)this,(byte)this[8] + 1,dest);
        if (this[0xb] ==
            (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
             )0x0) {
          i = 0xffffffff;
          lVar10 = 1;
          do {
            pbVar4 = child(this,(ulong)(byte)this[10] + lVar10);
            if (pbVar4 == (btree_node<phmap::priv::set_params<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_phmap::priv::(anonymous_namespace)::SubstringLess,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_256,_false>_>
                           *)0x0) {
              __assert_fail("child(count() + i + 1) != nullptr",
                            "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/btree.h"
                            ,0x91a,
                            "void phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>>::split(const int, btree_node<Params> *, allocator_type *) [Params = phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>]"
                           );
            }
            i = i + 1;
            pbVar4 = child(this,(ulong)(byte)this[10] + lVar10);
            init_child(dest,i,pbVar4);
            mutable_child(this,(ulong)(byte)this[10] + lVar10);
            lVar10 = lVar10 + 1;
          } while (i < (byte)dest[10]);
        }
        return;
      }
    }
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0xf84,
                "CopyConst<Char, ElementType<N>> *phmap::priv::internal_layout::LayoutImpl<std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>> *>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, phmap::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>> *, unsigned char, std::basic_string<char>, phmap::priv::btree_node<phmap::priv::set_params<std::basic_string<char>, phmap::priv::(anonymous namespace)::SubstringLess, std::allocator<std::basic_string<char>>, 256, false>> *>, SizeSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = phmap::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 1UL, Char = const char]"
               );
}

Assistant:

void btree_node<P>::split(const int insert_position, btree_node *dest,
                              allocator_type *alloc) {
        assert(dest->count() == 0);
        assert(max_count() == kNodeValues);

        // We bias the split based on the position being inserted. If we're
        // inserting at the beginning of the left node then bias the split to put
        // more values on the right node. If we're inserting at the end of the
        // right node then bias the split to put more values on the left node.
        if (insert_position == 0) {
            dest->set_count((field_type)(count() - 1));
        } else if (insert_position == kNodeValues) {
            dest->set_count(0);
        } else {
            dest->set_count((field_type)(count() / 2));
        }
        set_count((field_type)(count() - dest->count()));
        assert(count() >= 1);

        // Move values from the left sibling to the right sibling.
        uninitialized_move_n(dest->count(), count(), 0, dest, alloc);

        // Destroy the now-empty entries in the left node.
        value_destroy_n(count(), dest->count(), alloc);

        // The split key is the largest value in the left sibling.
        set_count((field_type)(count() - 1));
        parent()->emplace_value(position(), alloc, slot(count()));
        value_destroy(count(), alloc);
        parent()->init_child(position() + 1, dest);

        if (!leaf()) {
            for (int i = 0; i <= dest->count(); ++i) {
                assert(child(count() + i + 1) != nullptr);
                dest->init_child(i, child(count() + i + 1));
                clear_child(count() + i + 1);
            }
        }
    }